

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateInfoLoadFromString(HelicsFederateInfo fedInfo,char *args,HelicsError *err)

{
  FederateInfo *pFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  FederateInfo *info;
  HelicsError *in_stack_ffffffffffffff80;
  HelicsFederateInfo in_stack_ffffffffffffff88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  allocator<char> local_59 [9];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffd0;
  FederateInfo *in_stack_ffffffffffffffd8;
  
  pFVar1 = getFedInfo(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (pFVar1 != (FederateInfo *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    helics::FederateInfo::loadInfoFromArgs(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_ffffffffffffff90);
    std::__cxx11::string::~string(in_RSI);
    std::allocator<char>::~allocator(local_59);
  }
  return;
}

Assistant:

void helicsFederateInfoLoadFromString(HelicsFederateInfo fedInfo, const char* args, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    try {
        info->loadInfoFromArgs(args);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}